

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevcStreamReader.cpp
# Opt level: O0

void __thiscall HEVCStreamReader::~HEVCStreamReader(HEVCStreamReader *this)

{
  HevcSpsUnit *this_00;
  HEVCStreamReader *this_local;
  
  if (this->m_vps != (HevcVpsUnit *)0x0) {
    operator_delete(this->m_vps,0x50);
  }
  this_00 = this->m_sps;
  if (this_00 != (HevcSpsUnit *)0x0) {
    HevcSpsUnit::~HevcSpsUnit(this_00);
    operator_delete(this_00,0xa0);
  }
  if (this->m_pps != (HevcPpsUnit *)0x0) {
    operator_delete(this->m_pps,0x48);
  }
  if (this->m_hdr != (HevcHdrUnit *)0x0) {
    operator_delete(this->m_hdr,0x40);
  }
  if (this->m_slice != (HevcSliceHeader *)0x0) {
    operator_delete(this->m_slice,0x48);
  }
  MemoryBlock::~MemoryBlock(&this->m_ppsBuffer);
  MemoryBlock::~MemoryBlock(&this->m_spsBuffer);
  MemoryBlock::~MemoryBlock(&this->m_vpsBuffer);
  MPEGStreamReader::~MPEGStreamReader(&this->super_MPEGStreamReader);
  return;
}

Assistant:

HEVCStreamReader::~HEVCStreamReader()
{
    delete m_vps;
    delete m_sps;
    delete m_pps;
    delete m_hdr;
    delete m_slice;
}